

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O0

void __thiscall btRigidBody::addConstraintRef(btRigidBody *this,btTypedConstraint *c)

{
  int iVar1;
  int iVar2;
  btRigidBody *this_00;
  btRigidBody *co;
  btTypedConstraint *in_RSI;
  btRigidBody *in_RDI;
  btCollisionObject *colObjB;
  btCollisionObject *colObjA;
  int index;
  bool ignoreCollisionCheck;
  btTypedConstraint **in_stack_ffffffffffffffd8;
  btAlignedObjectArray<btTypedConstraint_*> *in_stack_ffffffffffffffe0;
  
  iVar1 = btAlignedObjectArray<btTypedConstraint_*>::findLinearSearch
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  iVar2 = btAlignedObjectArray<btTypedConstraint_*>::size(&in_RDI->m_constraintRefs);
  if (iVar1 == iVar2) {
    btAlignedObjectArray<btTypedConstraint_*>::push_back
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    this_00 = btTypedConstraint::getRigidBodyA(in_RSI);
    co = btTypedConstraint::getRigidBodyB(in_RSI);
    ignoreCollisionCheck = SUB41((uint)iVar1 >> 0x18,0);
    if (this_00 == in_RDI) {
      btCollisionObject::setIgnoreCollisionCheck
                (&this_00->super_btCollisionObject,&co->super_btCollisionObject,ignoreCollisionCheck
                );
    }
    else {
      btCollisionObject::setIgnoreCollisionCheck
                (&this_00->super_btCollisionObject,&co->super_btCollisionObject,ignoreCollisionCheck
                );
    }
  }
  return;
}

Assistant:

void btRigidBody::addConstraintRef(btTypedConstraint* c)
{
	///disable collision with the 'other' body

	int index = m_constraintRefs.findLinearSearch(c);
	//don't add constraints that are already referenced
	//btAssert(index == m_constraintRefs.size());
	if (index == m_constraintRefs.size())
	{
		m_constraintRefs.push_back(c);
		btCollisionObject* colObjA = &c->getRigidBodyA();
		btCollisionObject* colObjB = &c->getRigidBodyB();
		if (colObjA == this)
		{
			colObjA->setIgnoreCollisionCheck(colObjB, true);
		}
		else
		{
			colObjB->setIgnoreCollisionCheck(colObjA, true);
		}
	} 
}